

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-memory.c
# Opt level: O2

void bson_mem_set_vtable(bson_mem_vtable_t *vtable)

{
  if (vtable == (bson_mem_vtable_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-memory.c"
            ,0x116,"bson_mem_set_vtable","vtable");
    abort();
  }
  if ((((vtable->malloc != (_func_void_ptr_size_t *)0x0) &&
       (vtable->calloc != (_func_void_ptr_size_t_size_t *)0x0)) &&
      (vtable->realloc != (_func_void_ptr_void_ptr_size_t *)0x0)) &&
     (vtable->free != (_func_void_void_ptr *)0x0)) {
    gMemVtable.padding[2] = vtable->padding[2];
    gMemVtable.padding[3] = vtable->padding[3];
    gMemVtable.padding[0] = vtable->padding[0];
    gMemVtable.padding[1] = vtable->padding[1];
    gMemVtable.realloc = vtable->realloc;
    gMemVtable.free = vtable->free;
    gMemVtable.malloc = vtable->malloc;
    gMemVtable.calloc = vtable->calloc;
    return;
  }
  fwrite("Failure to install BSON vtable, missing functions.\n",0x33,1,_stderr);
  return;
}

Assistant:

void
bson_mem_set_vtable (const bson_mem_vtable_t *vtable)
{
   BSON_ASSERT (vtable);

   if (!vtable->malloc || !vtable->calloc || !vtable->realloc ||
       !vtable->free) {
      fprintf (stderr,
               "Failure to install BSON vtable, "
               "missing functions.\n");
      return;
   }

   gMemVtable = *vtable;
}